

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# possible-contents.cpp
# Opt level: O3

void __thiscall
PossibleContentsTest_TestComparisons_Test::TestBody(PossibleContentsTest_TestComparisons_Test *this)

{
  PossibleContents *pPVar1;
  PossibleContents *pPVar2;
  PossibleContents *b;
  PossibleContents *b_00;
  PossibleContents *pPVar3;
  
  pPVar1 = &(this->super_PossibleContentsTest).none;
  assertEqualSymmetric<wasm::PossibleContents>(pPVar1,pPVar1);
  pPVar3 = &(this->super_PossibleContentsTest).i32Zero;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar1,pPVar3);
  pPVar2 = &(this->super_PossibleContentsTest).i32Global1;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar1,pPVar2);
  b = &(this->super_PossibleContentsTest).exactI32;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar1,b);
  b_00 = &(this->super_PossibleContentsTest).many;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar1,b_00);
  assertEqualSymmetric<wasm::PossibleContents>(pPVar3,pPVar3);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,&(this->super_PossibleContentsTest).i32One)
  ;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,&(this->super_PossibleContentsTest).f64One)
  ;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,pPVar2);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,b);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,b_00);
  assertEqualSymmetric<wasm::PossibleContents>(pPVar2,pPVar2);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (pPVar2,&(this->super_PossibleContentsTest).i32Global2);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar2,b);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar2,b_00);
  assertEqualSymmetric<wasm::PossibleContents>(b,b);
  pPVar1 = &(this->super_PossibleContentsTest).exactAnyref;
  assertNotEqualSymmetric<wasm::PossibleContents>(b,pPVar1);
  assertNotEqualSymmetric<wasm::PossibleContents>(b,b_00);
  assertEqualSymmetric<wasm::PossibleContents>(b_00,b_00);
  pPVar2 = &(this->super_PossibleContentsTest).anyNull;
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,pPVar2);
  assertNotEqualSymmetric<wasm::PossibleContents>
            (pPVar2,&(this->super_PossibleContentsTest).funcNull);
  assertEqualSymmetric<wasm::PossibleContents>(pPVar2,pPVar2);
  pPVar3 = &(this->super_PossibleContentsTest).exactNonNullAnyref;
  assertEqualSymmetric<wasm::PossibleContents>(pPVar3,pPVar3);
  assertNotEqualSymmetric<wasm::PossibleContents>(pPVar3,pPVar1);
  return;
}

Assistant:

TEST_F(PossibleContentsTest, TestComparisons) {
  assertEqualSymmetric(none, none);
  assertNotEqualSymmetric(none, i32Zero);
  assertNotEqualSymmetric(none, i32Global1);
  assertNotEqualSymmetric(none, exactI32);
  assertNotEqualSymmetric(none, many);

  assertEqualSymmetric(i32Zero, i32Zero);
  assertNotEqualSymmetric(i32Zero, i32One);
  assertNotEqualSymmetric(i32Zero, f64One);
  assertNotEqualSymmetric(i32Zero, i32Global1);
  assertNotEqualSymmetric(i32Zero, exactI32);
  assertNotEqualSymmetric(i32Zero, many);

  assertEqualSymmetric(i32Global1, i32Global1);
  assertNotEqualSymmetric(i32Global1, i32Global2);
  assertNotEqualSymmetric(i32Global1, exactI32);
  assertNotEqualSymmetric(i32Global1, many);

  assertEqualSymmetric(exactI32, exactI32);
  assertNotEqualSymmetric(exactI32, exactAnyref);
  assertNotEqualSymmetric(exactI32, many);

  assertEqualSymmetric(many, many);

  // Nulls

  assertNotEqualSymmetric(i32Zero, anyNull);
  assertNotEqualSymmetric(anyNull, funcNull);
  assertEqualSymmetric(anyNull, anyNull);

  assertEqualSymmetric(exactNonNullAnyref, exactNonNullAnyref);
  assertNotEqualSymmetric(exactNonNullAnyref, exactAnyref);
}